

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetTextureAddressModeLiteralName
                 (TEXTURE_ADDRESS_MODE AddressMode,bool bGetFullName)

{
  Char *Message;
  char (*in_R8) [2];
  uint local_3c;
  undefined1 local_38 [8];
  string msg;
  bool bGetFullName_local;
  char *pcStack_10;
  TEXTURE_ADDRESS_MODE AddressMode_local;
  
  switch(AddressMode) {
  case TEXTURE_ADDRESS_UNKNOWN:
    pcStack_10 = "unknown";
    if (bGetFullName) {
      pcStack_10 = "TEXTURE_ADDRESS_UNKNOWN";
    }
    break;
  case TEXTURE_ADDRESS_WRAP:
    pcStack_10 = "wrap";
    if (bGetFullName) {
      pcStack_10 = "TEXTURE_ADDRESS_WRAP";
    }
    break;
  case TEXTURE_ADDRESS_MIRROR:
    pcStack_10 = "mirror";
    if (bGetFullName) {
      pcStack_10 = "TEXTURE_ADDRESS_MIRROR";
    }
    break;
  case TEXTURE_ADDRESS_CLAMP:
    pcStack_10 = "clamp";
    if (bGetFullName) {
      pcStack_10 = "TEXTURE_ADDRESS_CLAMP";
    }
    break;
  case TEXTURE_ADDRESS_BORDER:
    pcStack_10 = "border";
    if (bGetFullName) {
      pcStack_10 = "TEXTURE_ADDRESS_BORDER";
    }
    break;
  case TEXTURE_ADDRESS_MIRROR_ONCE:
    pcStack_10 = "mirror once";
    if (bGetFullName) {
      pcStack_10 = "TEXTURE_ADDRESS_MIRROR_ONCE";
    }
    break;
  default:
    local_3c = (uint)AddressMode;
    msg.field_2._M_local_buf[0xe] = bGetFullName;
    msg.field_2._M_local_buf[0xf] = AddressMode;
    FormatString<char[34],unsigned_int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected texture address mode (",
               (char (*) [34])&local_3c,(uint *)0xf65f2d,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetTextureAddressModeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x39d);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetTextureAddressModeLiteralName(TEXTURE_ADDRESS_MODE AddressMode, bool bGetFullName)
{
    static_assert(TEXTURE_ADDRESS_NUM_MODES == 6, "Please update the switch below to handle the new texture address mode");
    switch (AddressMode)
    {
        // clang-format off
        case TEXTURE_ADDRESS_UNKNOWN:     return bGetFullName ? "TEXTURE_ADDRESS_UNKNOWN"     : "unknown";
        case TEXTURE_ADDRESS_WRAP:        return bGetFullName ? "TEXTURE_ADDRESS_WRAP"        : "wrap";
        case TEXTURE_ADDRESS_MIRROR:      return bGetFullName ? "TEXTURE_ADDRESS_MIRROR"      : "mirror";
        case TEXTURE_ADDRESS_CLAMP:       return bGetFullName ? "TEXTURE_ADDRESS_CLAMP"       : "clamp";
        case TEXTURE_ADDRESS_BORDER:      return bGetFullName ? "TEXTURE_ADDRESS_BORDER"      : "border";
        case TEXTURE_ADDRESS_MIRROR_ONCE: return bGetFullName ? "TEXTURE_ADDRESS_MIRROR_ONCE" : "mirror once";
        // clang-format on
        default:
            UNEXPECTED("Unexpected texture address mode (", Uint32{AddressMode}, ")");
            return "UNKNOWN";
    }
}